

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O2

btVector3 * __thiscall btVector3::operator*=(btVector3 *this,btVector3 *v)

{
  this->m_floats[0] = v->m_floats[0] * this->m_floats[0];
  this->m_floats[1] = v->m_floats[1] * this->m_floats[1];
  this->m_floats[2] = v->m_floats[2] * this->m_floats[2];
  return this;
}

Assistant:

SIMD_FORCE_INLINE btVector3& operator*=(const btVector3& v)
	{
#if defined(BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
		mVec128 = _mm_mul_ps(mVec128, v.mVec128);
#elif defined(BT_USE_NEON)
		mVec128 = vmulq_f32(mVec128, v.mVec128);
#else
		m_floats[0] *= v.m_floats[0];
		m_floats[1] *= v.m_floats[1];
		m_floats[2] *= v.m_floats[2];
#endif
		return *this;
	}